

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall ExprWriterTest_WriteIfExpr_Test::TestBody(ExprWriterTest_WriteIfExpr_Test *this)

{
  ExprBase rhs;
  ExprBase then_expr;
  Reference RVar1;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  BVar2;
  ExprBase args;
  ExprFactory *this_00;
  char *pcVar3;
  AssertHelper local_58;
  AssertionResult gtest_ar;
  string local_40;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  rhs.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.0);
  then_expr.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,1.0);
  RVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
  BVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,EQ,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                     impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_);
  args.impl_ = rhs.impl_;
  local_58.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar2.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)then_expr.impl_,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_40,(fmt *)0x14e4d3,(CStringRef)&local_58,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)args.impl_);
  testing::internal::CmpHelperEQ<char[17],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if x1 = 0 then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n1, n0)))"
             ,(char (*) [17])"if x1 = 0 then 1",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x11f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  RVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
  BVar2 = mp::BasicExprFactory<std::allocator<char>>::
          MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                    ((BasicExprFactory<std::allocator<char>> *)this_00,EQ,
                     (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                     RVar1.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.
                     impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_);
  local_58.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  BVar2.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_,
                  (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)then_expr.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_40,(fmt *)0x14e4d3,(CStringRef)&local_58,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)then_expr.impl_);
  testing::internal::CmpHelperEQ<char[24],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if x1 = 0 then 0 else 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n0, n1)))"
             ,(char (*) [24])"if x1 = 0 then 0 else 1",&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_40);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x121,pcVar3);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_40);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteIfExpr) {
  auto n0 = MakeConst(0), n1 = MakeConst(1);
  CHECK_WRITE("if x1 = 0 then 1",
      MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n1, n0));
  CHECK_WRITE("if x1 = 0 then 0 else 1",
      MakeIf(MakeRelational(ex::EQ, MakeVariable(0), n0), n0, n1));
}